

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeCheckerTester.cpp
# Opt level: O0

void __thiscall psy::C::TypeCheckerTester::case0556(TypeCheckerTester *this)

{
  Expectation local_108;
  allocator<char> local_39;
  string local_38;
  char *local_18;
  char *s;
  TypeCheckerTester *this_local;
  
  local_18 = "\nstruct s { int m ; } t ;\nvoid _ ()\n{\n    struct s x ;\n    & x ;\n}\n";
  s = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,
             "\nstruct s { int m ; } t ;\nvoid _ ()\n{\n    struct s x ;\n    & x ;\n}\n",&local_39)
  ;
  Expectation::Expectation(&local_108);
  checkTypes(this,&local_38,&local_108);
  Expectation::~Expectation(&local_108);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  return;
}

Assistant:

void TypeCheckerTester::case0556()
{
    auto s = R"(
struct s { int m ; } t ;
void _ ()
{
    struct s x ;
    & x ;
}
)";

    checkTypes(s, Expectation());
}